

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

int * __thiscall embree::Stream<int>::peek(Stream<int> *this)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  uint uVar3;
  ParseLocation l;
  pair<int,_embree::ParseLocation> local_38;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&l,this);
    local_38.first = (*(this->super_RefCount)._vptr_RefCount[4])(this);
    ParseLocation::ParseLocation(&local_38.second,&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&l.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    sVar2 = this->past;
    sVar1 = this->future;
    if (sVar1 + sVar2 == 0x400) {
      if (sVar2 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar3;
      sVar2 = sVar2 - 1;
      this->past = sVar2;
    }
    else {
      uVar3 = (uint)this->start;
    }
    this->future = sVar1 + 1;
    std::pair<int,_embree::ParseLocation>::operator=
              ((this->buffer).
               super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start + ((int)sVar2 + uVar3 + (int)sVar1 & 0x3ff)
               ,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.second.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return &(this->buffer).
          super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)this->past + (int)this->start & 0x3ff].
          first;
}

Assistant:

const T& peek() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].first;
    }